

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

istream * nlohmann::operator>>
                    (istream *i,
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *j)

{
  undefined1 local_119;
  input_adapter_t local_118;
  _Any_data local_108;
  code *local_f8;
  undefined8 uStack_f0;
  input_stream_adapter *local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_d8;
  
  local_e8 = (input_stream_adapter *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nlohmann::detail::input_stream_adapter,std::allocator<nlohmann::detail::input_stream_adapter>,std::istream&>
            (&local_e0,&local_e8,(allocator<nlohmann::detail::input_stream_adapter> *)&local_119,i);
  local_118.super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = &local_e8->super_input_adapter_protocol;
  local_118.super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = local_e0._M_pi;
  if (local_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_e0._M_pi)->_M_use_count = (local_e0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_e0._M_pi)->_M_use_count = (local_e0._M_pi)->_M_use_count + 1;
    }
  }
  local_f8 = (code *)0x0;
  uStack_f0 = 0;
  local_108._M_unused._M_object = (void *)0x0;
  local_108._8_8_ = 0;
  detail::
  parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::parser(&local_d8,&local_118,(parser_callback_t *)&local_108,true);
  detail::
  parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::parse(&local_d8,false,j);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.m_lexer.token_buffer._M_dataplus._M_p != &local_d8.m_lexer.token_buffer.field_2) {
    operator_delete(local_d8.m_lexer.token_buffer._M_dataplus._M_p,
                    local_d8.m_lexer.token_buffer.field_2._M_allocated_capacity + 1);
  }
  if (local_d8.m_lexer.token_string.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.m_lexer.token_string.super__Vector_base<char,_std::allocator<char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.m_lexer.token_string.
                          super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.m_lexer.token_string.
                          super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_d8.m_lexer.ia.
      super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.m_lexer.ia.
               super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_d8.callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_d8.callback.super__Function_base._M_manager)
              ((_Any_data *)&local_d8.callback,(_Any_data *)&local_d8.callback,__destroy_functor);
  }
  if (local_f8 != (code *)0x0) {
    (*local_f8)(&local_108,&local_108,__destroy_functor);
  }
  if (local_118.
      super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.
               super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0._M_pi);
  }
  return i;
}

Assistant:

friend std::istream& operator>>(std::istream& i, basic_json& j)
{
parser(detail::input_adapter(i)).parse(false, j);
return i;
}